

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

TCGv_i32 gen_ldst(DisasContext_conflict2 *s,int opsize,TCGv_i32 addr,TCGv_i32 val,ea_what what,
                 int index)

{
  TCGContext_conflict2 *pTVar1;
  TCGv_i32 tmp;
  
  if (what == EA_STORE) {
    pTVar1 = s->uc->tcg_ctx;
    gen_store(s,opsize,addr,val,index);
    tmp = pTVar1->store_dummy;
  }
  else {
    tmp = gen_load(s,opsize,addr,(uint)(what == EA_LOADS),index);
    mark_to_release(s,tmp);
  }
  return tmp;
}

Assistant:

static TCGv gen_ldst(DisasContext *s, int opsize, TCGv addr, TCGv val,
                     ea_what what, int index)
{
    if (what == EA_STORE) {
        TCGContext *tcg_ctx = s->uc->tcg_ctx;
        gen_store(s, opsize, addr, val, index);
        return tcg_ctx->store_dummy;
    } else {
        return mark_to_release(s, gen_load(s, opsize, addr,
                                           what == EA_LOADS, index));
    }
}